

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryEncoder.cc
# Opt level: O2

void __thiscall avro::BinaryEncoder::setItemCount(BinaryEncoder *this,size_t count)

{
  Exception *this_00;
  allocator<char> local_39;
  string local_38;
  
  if (count != 0) {
    doEncodeLong(this,count);
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Count cannot be zero",&local_39);
  Exception::Exception(this_00,&local_38);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void BinaryEncoder::setItemCount(size_t count)
{
    if (count == 0) {
        throw Exception("Count cannot be zero");
    }
    doEncodeLong(count);
}